

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_variable.cpp
# Opt level: O2

adios2_error adios2_variable_type(adios2_type *type,adios2_variable *variable)

{
  allocator local_50 [32];
  string local_30;
  
  std::__cxx11::string::string
            ((string *)&local_30,"for const adios2_variable, in call to adios2_variable_type",
             local_50);
  adios2::helper::CheckForNullptr<adios2_variable_const>(variable,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  switch(*(undefined4 *)(variable + 0x28)) {
  case 1:
    *type = adios2_type_int8_t;
    break;
  case 2:
    *type = adios2_type_int16_t;
    break;
  case 3:
    *type = adios2_type_int32_t;
    break;
  case 4:
    *type = adios2_type_int64_t;
    break;
  case 5:
    *type = adios2_type_uint8_t;
    break;
  case 6:
    *type = adios2_type_uint16_t;
    break;
  case 7:
    *type = adios2_type_uint32_t;
    break;
  case 8:
    *type = adios2_type_uint64_t;
    break;
  case 9:
    *type = adios2_type_float;
    break;
  case 10:
    *type = adios2_type_double;
    break;
  case 0xb:
    *type = adios2_type_long_double;
    break;
  case 0xc:
    *type = adios2_type_float_complex;
    break;
  case 0xd:
    *type = adios2_type_double_complex;
    break;
  case 0xe:
    *type = adios2_type_string;
    break;
  default:
    *type = adios2_type_unknown;
  }
  return adios2_error_none;
}

Assistant:

adios2_error adios2_variable_type(adios2_type *type, const adios2_variable *variable)
{
    try
    {
        adios2::helper::CheckForNullptr(
            variable, "for const adios2_variable, in call to adios2_variable_type");

        const adios2::core::VariableBase *variableBase =
            reinterpret_cast<const adios2::core::VariableBase *>(variable);

        const adios2::DataType typeCpp = variableBase->m_Type;
        if (typeCpp == adios2::helper::GetDataType<std::string>())
        {
            *type = adios2_type_string;
        }
#define make_case(T)                                                                               \
    else if (typeCpp == adios2::helper::GetDataType<MapAdios2Type<T>::Type>())                     \
    {                                                                                              \
        *type = T;                                                                                 \
    }
        ADIOS2_FOREACH_C_TYPE_1ARG(make_case)
#undef make_case
        else
        {
            *type = adios2_type_unknown;
        }
        return adios2_error_none;
    }
    catch (...)
    {
        return static_cast<adios2_error>(adios2::helper::ExceptionToError("adios2_variable_type"));
    }
}